

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O0

void ihevc_inter_pred_luma_vert
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  UWORD8 UVar1;
  short sVar2;
  WORD16 i2_tmp;
  WORD32 i;
  WORD32 col;
  WORD32 row;
  WORD32 ht_local;
  WORD8 *pi1_coeff_local;
  WORD32 dst_strd_local;
  WORD32 src_strd_local;
  UWORD8 *pu1_dst_local;
  UWORD8 *pu1_src_local;
  
  pu1_dst_local = pu1_dst;
  pu1_src_local = pu1_src;
  for (row = 0; row < ht; row = row + 1) {
    for (col = 0; col < wd; col = col + 1) {
      i2_tmp = 0;
      for (i = 0; i < 8; i = i + 1) {
        i2_tmp = i2_tmp + (short)pi1_coeff[i] * (ushort)pu1_src_local[col + (i + -3) * src_strd];
      }
      sVar2 = (short)(i2_tmp + 0x20 >> 6);
      if (sVar2 < 0x100) {
        if (sVar2 < 0) {
          sVar2 = 0;
        }
        UVar1 = (UWORD8)sVar2;
      }
      else {
        UVar1 = 0xff;
      }
      pu1_dst_local[col] = UVar1;
    }
    pu1_src_local = pu1_src_local + src_strd;
    pu1_dst_local = pu1_dst_local + dst_strd;
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_vert(UWORD8 *pu1_src,
                                UWORD8 *pu1_dst,
                                WORD32 src_strd,
                                WORD32 dst_strd,
                                WORD8 *pi1_coeff,
                                WORD32 ht,
                                WORD32 wd)
{
    WORD32 row, col, i;
    WORD16 i2_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            i2_tmp = 0;
            for(i = 0; i < NTAPS_LUMA; i++)
                i2_tmp += pi1_coeff[i] * pu1_src[col + (i - 3) * src_strd];

            i2_tmp = (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH;
            i2_tmp = CLIP_U8(i2_tmp);

            pu1_dst[col] = (UWORD8)i2_tmp;
        }

        pu1_src += src_strd;
        pu1_dst += dst_strd;
    }

}